

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O2

pboolean p_tree_rb_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                         PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key,
                         ppointer value)

{
  PTreeRBNode *node;
  PTreeRBNode *pPVar1;
  pint pVar2;
  PTreeBaseNode *pPVar3;
  PTreeBaseNode_ *pPVar4;
  PTreeBaseNode *pPVar5;
  PTreeRBNode *pPVar6;
  PTreeBaseNode_ *pPVar7;
  PTreeRBNode *pPVar8;
  pboolean pVar9;
  PTreeRBNode *node_00;
  PTreeBaseNode *pPVar10;
  
  pPVar5 = *root_node;
  pPVar7 = (PTreeBaseNode_ *)root_node;
  pPVar10 = pPVar5;
  do {
    if (pPVar5 == (PTreeBaseNode *)0x0) {
LAB_00114315:
      pPVar4 = (PTreeBaseNode_ *)p_malloc0(0x30);
      pPVar7->left = pPVar4;
      if (pPVar4 == (PTreeBaseNode_ *)0x0) {
LAB_0011430e:
        pVar9 = 0;
      }
      else {
        pPVar4->key = key;
        pPVar7->left->value = value;
        pPVar4 = pPVar7->left;
        *(undefined4 *)&pPVar4[1].right = 1;
        pPVar4[1].left = pPVar10;
        pVar9 = 1;
        pPVar8 = *(PTreeRBNode **)pPVar7;
        while (node_00 = pPVar8->parent, node_00 != (PTreeRBNode *)0x0) {
          if ((node_00->color & P_TREE_RB_COLOR_BLACK) != 0) {
            return 1;
          }
          node = node_00->parent;
          pPVar1 = (PTreeRBNode *)(node->base).left;
          pPVar6 = pPVar1;
          if (pPVar1 == node_00) {
            pPVar6 = (PTreeRBNode *)(node->base).right;
          }
          if ((pPVar6 == (PTreeRBNode *)0x0) || ((pPVar6->color & P_TREE_RB_COLOR_RED) == 0)) {
            if (pPVar1 != node_00) {
              if (pPVar8 == (PTreeRBNode *)(node_00->base).left) {
                pp_tree_rb_rotate_right(node_00,root_node);
                node_00 = (PTreeRBNode *)(pPVar8->base).right[1].left;
              }
              node->color = P_TREE_RB_COLOR_RED;
              node_00->color = P_TREE_RB_COLOR_BLACK;
              pp_tree_rb_rotate_left(node,root_node);
              return 1;
            }
            if (pPVar8 == (PTreeRBNode *)(node_00->base).right) {
              pp_tree_rb_rotate_left(node_00,root_node);
              node_00 = (PTreeRBNode *)(pPVar8->base).left[1].left;
            }
            node->color = P_TREE_RB_COLOR_RED;
            node_00->color = P_TREE_RB_COLOR_BLACK;
            pp_tree_rb_rotate_right(node,root_node);
            return 1;
          }
          node_00->color = P_TREE_RB_COLOR_BLACK;
          pPVar6->color = P_TREE_RB_COLOR_BLACK;
          node->color = P_TREE_RB_COLOR_RED;
          pPVar8 = node;
        }
        pPVar8->color = P_TREE_RB_COLOR_BLACK;
      }
      return pVar9;
    }
    pVar2 = (*compare_func)(key,pPVar5->key,data);
    if (pVar2 < 0) {
      pPVar3 = pPVar7->left;
      pPVar7 = pPVar3;
    }
    else {
      pPVar3 = pPVar7->left;
      if (pVar2 == 0) {
        if (pPVar3 != (PTreeBaseNode *)0x0) {
          if (key_destroy_func != (PDestroyFunc)0x0) {
            (*key_destroy_func)(pPVar3->key);
            pPVar3 = pPVar7->left;
          }
          if (value_destroy_func != (PDestroyFunc)0x0) {
            (*value_destroy_func)(pPVar3->value);
            pPVar3 = pPVar7->left;
          }
          pPVar3->key = key;
          pPVar7->left->value = value;
          goto LAB_0011430e;
        }
        goto LAB_00114315;
      }
      pPVar7 = (PTreeBaseNode_ *)&pPVar3->right;
    }
    pPVar5 = pPVar7->left;
    pPVar10 = pPVar3;
  } while( true );
}

Assistant:

pboolean
p_tree_rb_insert (PTreeBaseNode		**root_node,
		  PCompareDataFunc	compare_func,
		  ppointer		data,
		  PDestroyFunc		key_destroy_func,
		  PDestroyFunc		value_destroy_func,
		  ppointer		key,
		  ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeRBNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeRBNode *) *cur_node)->color  = P_TREE_RB_COLOR_RED;
	((PTreeRBNode *) *cur_node)->parent = (PTreeRBNode *) parent_node;

	/* Balance the tree */
	pp_tree_rb_balance_insert ((PTreeRBNode *) *cur_node, root_node);

	return TRUE;
}